

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

void StartEventThrd(ALCcontext *ctx)

{
  ALCcontext **unaff_retaddr;
  _func_int_ALCcontext_ptr *in_stack_00000008;
  exception *e;
  thread *in_stack_ffffffffffffffc8;
  thread *in_stack_ffffffffffffffd0;
  
  std::thread::thread<int(&)(ALCcontext*),ALCcontext*&,void>
            ((thread *)e,in_stack_00000008,unaff_retaddr);
  std::thread::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::thread::~thread((thread *)0x152ee1);
  return;
}

Assistant:

void StartEventThrd(ALCcontext *ctx)
{
    try {
        ctx->mEventThread = std::thread{EventThread, ctx};
    }
    catch(std::exception& e) {
        ERR("Failed to start event thread: %s\n", e.what());
    }
    catch(...) {
        ERR("Failed to start event thread! Expect problems.\n");
    }
}